

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O2

String * __thiscall
indigox::Molecule::GetName_abi_cxx11_(String *__return_storage_ptr__,Molecule *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name_);
  return __return_storage_ptr__;
}

Assistant:

String Molecule::GetName() const { return name_; }